

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int commit_send_packet(quicly_conn_t *conn,quicly_send_context_t *s,
                      en_quicly_send_packet_mode_t mode)

{
  quicly_sentmap_t *map;
  uint64_t *puVar1;
  ushort uVar2;
  byte *pbVar3;
  st_quicly_cipher_context_t *psVar4;
  ptls_aead_context_t *ppVar5;
  size_t sVar6;
  st_quicly_crypto_engine_t *psVar7;
  int64_t iVar8;
  _func_void_void_ptr_char_ptr_varargs *p_Var9;
  iovec *piVar10;
  byte bVar11;
  int iVar12;
  uint8_t *puVar13;
  st_quicly_application_space_t *psVar14;
  quicly_sent_t *pqVar15;
  ulong packet_number;
  uint64_t uVar16;
  long lVar17;
  ulong uVar18;
  uint8_t *puVar19;
  ptls_iovec_t pVar20;
  
  if (((s->target).cipher)->aead == (ptls_aead_context_t *)0x0) {
    __assert_fail("s->target.cipher->aead != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xbb0,
                  "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                 );
  }
  puVar19 = s->dst;
  puVar13 = s->dst_payload_from;
  if (puVar19 == puVar13) {
    __assert_fail("s->dst != s->dst_payload_from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xbb2,
                  "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                 );
  }
  while ((long)puVar19 - (long)puVar13 < 2) {
    s->dst = puVar19 + 1;
    *puVar19 = '\0';
    puVar13 = s->dst_payload_from;
    puVar19 = s->dst;
  }
  if (mode == QUICLY_COMMIT_SEND_PACKET_MODE_FULL_SIZE) {
    if (s->num_datagrams == 0) {
      uVar18 = (ulong)(conn->egress).max_udp_payload_size;
    }
    else {
      uVar18 = (ulong)(conn->egress).max_udp_payload_size;
      if (s->datagrams[s->num_datagrams - 1].iov_len != uVar18) {
        __assert_fail("s->num_datagrams == 0 || s->datagrams[s->num_datagrams - 1].iov_len == conn->egress.max_udp_payload_size"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0xbb9,
                      "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                     );
      }
    }
    uVar18 = uVar18 - 0x10;
    puVar13 = (s->payload_buf).datagram;
    if (uVar18 < (ulong)((long)puVar19 - (long)puVar13)) {
      __assert_fail("s->dst - s->payload_buf.datagram <= max_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xbbb,
                    "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                   );
    }
    memset(puVar19,0,(size_t)(puVar13 + (uVar18 - (long)puVar19)));
    puVar19 = (s->payload_buf).datagram + uVar18;
    s->dst = puVar19;
  }
  if ((char)*(s->target).first_byte_at < '\0') {
    puVar13 = s->dst_payload_from;
    iVar12 = (int)((s->target).cipher)->aead->algo->tag_size + ((int)puVar19 - (int)puVar13) + 2;
    puVar13[-4] = (byte)((uint)iVar12 >> 8) | 0x40;
    puVar13[-3] = (uint8_t)iVar12;
  }
  else {
    psVar14 = conn->application;
    if ((psVar14->cipher).egress.key_update_pn.next <= (conn->egress).packet_number) {
      iVar12 = update_1rtt_egress_key(conn);
      if (iVar12 != 0) {
        return iVar12;
      }
      psVar14 = conn->application;
    }
    if (((psVar14->cipher).egress.key_phase & 1) != 0) {
      pbVar3 = (s->target).first_byte_at;
      *pbVar3 = *pbVar3 | 4;
    }
  }
  uVar2 = (ushort)(conn->egress).packet_number;
  *(ushort *)(s->dst_payload_from + -2) = uVar2 << 8 | uVar2 >> 8;
  psVar4 = (s->target).cipher;
  puVar19 = (s->payload_buf).datagram;
  ppVar5 = psVar4->aead;
  puVar13 = s->dst;
  sVar6 = ppVar5->algo->tag_size;
  s->dst = puVar13 + sVar6;
  uVar18 = (long)(puVar13 + sVar6) - (long)puVar19;
  if (uVar18 <= (conn->egress).max_udp_payload_size) {
    psVar7 = ((conn->super).ctx)->crypto_engine;
    pVar20.len = uVar18;
    pVar20.base = puVar19;
    (*psVar7->encrypt_packet)
              (psVar7,conn,psVar4->header_protection,ppVar5,pVar20,
               (long)(s->target).first_byte_at - (long)puVar19,
               (long)s->dst_payload_from - (long)puVar19,(conn->egress).packet_number,
               (uint)(mode == QUICLY_COMMIT_SEND_PACKET_MODE_COALESCED));
    if (((s->target).field_0x10 & 1) == 0) {
      lVar17 = 0;
    }
    else {
      lVar17 = (long)s->dst - (long)(s->target).first_byte_at;
      s->send_window = s->send_window - lVar17;
    }
    map = &(conn->egress).loss.sentmap;
    if ((conn->egress).loss.sentmap._pending_packet != (quicly_sent_t *)0x0) {
      quicly_sentmap_commit(map,(uint16_t)lVar17);
    }
    (*((conn->egress).cc.type)->cc_on_sent)
              (&(conn->egress).cc,&(conn->egress).loss,(uint32_t)lVar17,(conn->stash).now);
    iVar8 = (conn->stash).now;
    uVar16 = (conn->egress).packet_number;
    puVar19 = (s->target).first_byte_at;
    puVar13 = s->dst;
    bVar11 = get_epoch(*puVar19);
    p_Var9 = (conn->super).tracer.cb;
    if (p_Var9 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
      (*p_Var9)((conn->super).tracer.ctx,
                "{\"type\":\"packet-sent\", \"time\":%lld, \"pn\":%llu, \"len\":%llu, \"packet-type\":%llu, \"ack-only\":%lld}\n"
                ,iVar8,uVar16,(long)puVar13 - (long)puVar19,(ulong)bVar11,
                (ulong)(~*(uint *)&(s->target).field_0x10 & 1));
    }
    uVar16 = (conn->egress).packet_number;
    puVar1 = &(conn->super).stats.num_packets.sent;
    *puVar1 = *puVar1 + 1;
    packet_number = uVar16 + 1;
    (conn->egress).packet_number = packet_number;
    if (mode != QUICLY_COMMIT_SEND_PACKET_MODE_COALESCED) {
      puVar1 = &(conn->super).stats.num_bytes.sent;
      *puVar1 = *puVar1 + uVar18;
      piVar10 = s->datagrams;
      sVar6 = s->num_datagrams;
      s->num_datagrams = sVar6 + 1;
      puVar19 = (s->payload_buf).datagram;
      piVar10[sVar6].iov_base = puVar19;
      piVar10[sVar6].iov_len = uVar18;
      (s->payload_buf).datagram = puVar19 + uVar18;
      (s->target).cipher = (st_quicly_cipher_context_t *)0x0;
      (s->target).first_byte_at = (uint8_t *)0x0;
      packet_number = (conn->egress).packet_number;
    }
    iVar12 = 0;
    if (((((conn->egress).next_pn_to_skip <= packet_number) && (-1 < (char)(s->current).first_byte))
        && ((conn->super).state < QUICLY_STATE_CLOSING)) &&
       (iVar12 = quicly_sentmap_prepare(map,packet_number,(conn->stash).now,'\x03'), iVar12 == 0)) {
      pqVar15 = quicly_sentmap_allocate(map,on_invalid_ack);
      if (pqVar15 == (quicly_sent_t *)0x0) {
        iVar12 = 0x201;
      }
      else {
        iVar12 = 0;
        quicly_sentmap_commit(map,0);
        uVar16 = (conn->egress).packet_number + 1;
        (conn->egress).packet_number = uVar16;
        uVar16 = calc_next_pn_to_skip
                           (((conn->super).ctx)->tls,uVar16,(conn->egress).cc.cwnd,
                            (ulong)(conn->egress).max_udp_payload_size);
        (conn->egress).next_pn_to_skip = uVar16;
      }
    }
    return iVar12;
  }
  __assert_fail("datagram_size <= conn->egress.max_udp_payload_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0xbd4,
                "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
               );
}

Assistant:

static int commit_send_packet(quicly_conn_t *conn, quicly_send_context_t *s, enum en_quicly_send_packet_mode_t mode)
{
    size_t datagram_size, packet_bytes_in_flight;

    assert(s->target.cipher->aead != NULL);

    assert(s->dst != s->dst_payload_from);

    /* pad so that the pn + payload would be at least 4 bytes */
    while (s->dst - s->dst_payload_from < QUICLY_MAX_PN_SIZE - QUICLY_SEND_PN_SIZE)
        *s->dst++ = QUICLY_FRAME_TYPE_PADDING;

    if (mode == QUICLY_COMMIT_SEND_PACKET_MODE_FULL_SIZE) {
        assert(s->num_datagrams == 0 || s->datagrams[s->num_datagrams - 1].iov_len == conn->egress.max_udp_payload_size);
        const size_t max_size = conn->egress.max_udp_payload_size - QUICLY_AEAD_TAG_SIZE;
        assert(s->dst - s->payload_buf.datagram <= max_size);
        memset(s->dst, QUICLY_FRAME_TYPE_PADDING, s->payload_buf.datagram + max_size - s->dst);
        s->dst = s->payload_buf.datagram + max_size;
    }

    /* encode packet size, packet number, key-phase */
    if (QUICLY_PACKET_IS_LONG_HEADER(*s->target.first_byte_at)) {
        uint16_t length = s->dst - s->dst_payload_from + s->target.cipher->aead->algo->tag_size + QUICLY_SEND_PN_SIZE;
        /* length is always 2 bytes, see _do_prepare_packet */
        length |= 0x4000;
        quicly_encode16(s->dst_payload_from - QUICLY_SEND_PN_SIZE - 2, length);
    } else {
        if (conn->egress.packet_number >= conn->application->cipher.egress.key_update_pn.next) {
            int ret;
            if ((ret = update_1rtt_egress_key(conn)) != 0)
                return ret;
        }
        if ((conn->application->cipher.egress.key_phase & 1) != 0)
            *s->target.first_byte_at |= QUICLY_KEY_PHASE_BIT;
    }
    quicly_encode16(s->dst_payload_from - QUICLY_SEND_PN_SIZE, (uint16_t)conn->egress.packet_number);

    /* encrypt the packet */
    s->dst += s->target.cipher->aead->algo->tag_size;
    datagram_size = s->dst - s->payload_buf.datagram;
    assert(datagram_size <= conn->egress.max_udp_payload_size);

    conn->super.ctx->crypto_engine->encrypt_packet(conn->super.ctx->crypto_engine, conn, s->target.cipher->header_protection,
                                                   s->target.cipher->aead, ptls_iovec_init(s->payload_buf.datagram, datagram_size),
                                                   s->target.first_byte_at - s->payload_buf.datagram,
                                                   s->dst_payload_from - s->payload_buf.datagram, conn->egress.packet_number,
                                                   mode == QUICLY_COMMIT_SEND_PACKET_MODE_COALESCED);

    /* update CC, commit sentmap */
    if (s->target.ack_eliciting) {
        packet_bytes_in_flight = s->dst - s->target.first_byte_at;
        s->send_window -= packet_bytes_in_flight;
    } else {
        packet_bytes_in_flight = 0;
    }
    if (quicly_sentmap_is_open(&conn->egress.loss.sentmap))
        quicly_sentmap_commit(&conn->egress.loss.sentmap, (uint16_t)packet_bytes_in_flight);

    conn->egress.cc.type->cc_on_sent(&conn->egress.cc, &conn->egress.loss, (uint32_t)packet_bytes_in_flight, conn->stash.now);
    QUICLY_PROBE(PACKET_SENT, conn, conn->stash.now, conn->egress.packet_number, s->dst - s->target.first_byte_at,
                 get_epoch(*s->target.first_byte_at), !s->target.ack_eliciting);

    ++conn->egress.packet_number;
    ++conn->super.stats.num_packets.sent;

    if (mode != QUICLY_COMMIT_SEND_PACKET_MODE_COALESCED) {
        conn->super.stats.num_bytes.sent += datagram_size;
        s->datagrams[s->num_datagrams++] = (struct iovec){.iov_base = s->payload_buf.datagram, .iov_len = datagram_size};
        s->payload_buf.datagram += datagram_size;
        s->target.cipher = NULL;
        s->target.first_byte_at = NULL;
    }

    /* insert PN gap if necessary, registering the PN to the ack queue so that we'd close the connection in the event of receiving
     * an ACK for that gap. */
    if (conn->egress.packet_number >= conn->egress.next_pn_to_skip && !QUICLY_PACKET_IS_LONG_HEADER(s->current.first_byte) &&
        conn->super.state < QUICLY_STATE_CLOSING) {
        int ret;
        if ((ret = quicly_sentmap_prepare(&conn->egress.loss.sentmap, conn->egress.packet_number, conn->stash.now,
                                          QUICLY_EPOCH_1RTT)) != 0)
            return ret;
        if (quicly_sentmap_allocate(&conn->egress.loss.sentmap, on_invalid_ack) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        quicly_sentmap_commit(&conn->egress.loss.sentmap, 0);
        ++conn->egress.packet_number;
        conn->egress.next_pn_to_skip = calc_next_pn_to_skip(conn->super.ctx->tls, conn->egress.packet_number, conn->egress.cc.cwnd,
                                                            conn->egress.max_udp_payload_size);
    }

    return 0;
}